

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_read_key
              (mbedtls_ecp_group_id grp_id,mbedtls_ecp_keypair *key,uchar *buf,size_t buflen)

{
  mbedtls_mpi *X;
  int iVar1;
  mbedtls_mpi_uint *pmVar2;
  
  iVar1 = mbedtls_ecp_group_load(&key->grp,grp_id);
  if (iVar1 != 0) {
    return iVar1;
  }
  if ((key->grp).G.X.p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = -0x4e80;
LAB_00109c47:
    mbedtls_mpi_free(&key->d);
  }
  else {
    pmVar2 = (key->grp).G.Y.p;
    iVar1 = -0x4e80;
    if (grp_id == MBEDTLS_ECP_DP_CURVE25519 && pmVar2 == (mbedtls_mpi_uint *)0x0) {
      if (buflen != 0x20) {
        return -0x4c80;
      }
      X = &key->d;
      iVar1 = mbedtls_mpi_read_binary_le(X,buf,0x20);
      if ((((iVar1 != 0) || (iVar1 = mbedtls_mpi_set_bit(X,0,'\0'), iVar1 != 0)) ||
          (iVar1 = mbedtls_mpi_set_bit(X,1,'\0'), iVar1 != 0)) ||
         (((iVar1 = mbedtls_mpi_set_bit(X,2,'\0'), iVar1 != 0 ||
           (iVar1 = mbedtls_mpi_set_bit(X,0xff,'\0'), iVar1 != 0)) ||
          (iVar1 = mbedtls_mpi_set_bit(X,0xfe,'\x01'), iVar1 != 0)))) goto LAB_00109c47;
      if ((key->grp).G.X.p != (mbedtls_mpi_uint *)0x0) {
        pmVar2 = (key->grp).G.Y.p;
        iVar1 = 0;
        goto LAB_00109c0d;
      }
    }
    else {
LAB_00109c0d:
      if (pmVar2 != (mbedtls_mpi_uint *)0x0) {
        iVar1 = mbedtls_mpi_read_binary(&key->d,buf,buflen);
        if (iVar1 != 0) goto LAB_00109c47;
        iVar1 = mbedtls_ecp_check_privkey(&key->grp,&key->d);
      }
      if (iVar1 != 0) goto LAB_00109c47;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_read_key( mbedtls_ecp_group_id grp_id, mbedtls_ecp_keypair *key,
                          const unsigned char *buf, size_t buflen )
{
    int ret = 0;

    ECP_VALIDATE_RET( key  != NULL );
    ECP_VALIDATE_RET( buf  != NULL );

    if( ( ret = mbedtls_ecp_group_load( &key->grp, grp_id ) ) != 0 )
        return( ret );

    ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( &key->grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
    {
        /*
         * If it is Curve25519 curve then mask the key as mandated by RFC7748
         */
        if( grp_id == MBEDTLS_ECP_DP_CURVE25519 )
        {
            if( buflen != ECP_CURVE25519_KEY_SIZE )
                return MBEDTLS_ERR_ECP_INVALID_KEY;

            MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary_le( &key->d, buf, buflen ) );

            /* Set the three least significant bits to 0 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 0, 0 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 1, 0 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &key->d, 2, 0 ) );

            /* Set the most significant bit to 0 */
            MBEDTLS_MPI_CHK(
                    mbedtls_mpi_set_bit( &key->d,
                                         ECP_CURVE25519_KEY_SIZE * 8 - 1, 0 )
                    );

            /* Set the second most significant bit to 1 */
            MBEDTLS_MPI_CHK(
                    mbedtls_mpi_set_bit( &key->d,
                                         ECP_CURVE25519_KEY_SIZE * 8 - 2, 1 )
                    );
        }
        else
            ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    }

#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( &key->grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &key->d, buf, buflen ) );

        MBEDTLS_MPI_CHK( mbedtls_ecp_check_privkey( &key->grp, &key->d ) );
    }

#endif
cleanup:

    if( ret != 0 )
        mbedtls_mpi_free( &key->d );

    return( ret );
}